

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoint.cpp
# Opt level: O0

void __thiscall Liby::Endpoint::Endpoint(Endpoint *this,string *addr,uint16_t port)

{
  uint16_t uVar1;
  int iVar2;
  char *__cp;
  undefined8 *puVar3;
  int ret;
  uint16_t port_local;
  string *addr_local;
  Endpoint *this_local;
  
  __cp = (char *)std::__cxx11::string::data();
  iVar2 = inet_pton(2,__cp,&this->addr_);
  if (iVar2 == 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = anon_var_dwarf_6472a;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  if (iVar2 < -1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = anon_var_dwarf_64740;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  if (iVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = anon_var_dwarf_6474a;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  uVar1 = htons(port);
  this->port_ = uVar1;
  return;
}

Assistant:

Endpoint::Endpoint(const std::string &addr, uint16_t port) {
    int ret = ::inet_pton(AF_INET, addr.data(), &addr_);

    if (ret == 0) {
        throw "无效协议";
    } else if (ret < -1) {
        throw "遇到错误";
    } else if (ret != 1) {
        throw "未知错误";
    }

    port_ = htons(port);
}